

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O1

void __thiscall VDasher::moveTo(VDasher *this,VPointF *p)

{
  Dash *pDVar1;
  size_t sVar2;
  float fVar3;
  float fVar4;
  
  this->mDiscard = false;
  this->mStartNewSegment = true;
  this->mCurPt = *p;
  this->mIndex = 0;
  if (1e-06 <= ABS(this->mDashOffset)) {
    sVar2 = this->mArraySize;
    if (sVar2 == 0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = this->mDashArray[sVar2 - 1].length + this->mDashArray[sVar2 - 1].gap;
    }
    fVar3 = fmodf(this->mDashOffset,fVar4);
    if (this->mArraySize != 0) {
      fVar4 = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar3 |
                     (uint)(fVar4 + fVar3) & -(uint)(fVar3 < 0.0));
      pDVar1 = this->mDashArray;
      sVar2 = 0;
      do {
        fVar3 = pDVar1[sVar2].length;
        if (fVar4 < fVar3) {
          this->mIndex = sVar2;
          this->mCurrentLength = fVar3 - fVar4;
          this->mDiscard = false;
          break;
        }
        fVar4 = fVar4 - fVar3;
        if (fVar4 < pDVar1[sVar2].gap) {
          this->mIndex = sVar2;
          this->mCurrentLength = pDVar1[sVar2].gap - fVar4;
          this->mDiscard = true;
          break;
        }
        fVar4 = fVar4 - pDVar1[sVar2].gap;
        sVar2 = sVar2 + 1;
      } while (this->mArraySize != sVar2);
    }
  }
  else {
    this->mCurrentLength = this->mDashArray->length;
  }
  if (ABS(this->mCurrentLength) <= 1e-06) {
    updateActiveSegment(this);
    return;
  }
  return;
}

Assistant:

void VDasher::moveTo(const VPointF &p)
{
    mDiscard = false;
    mStartNewSegment = true;
    mCurPt = p;
    mIndex = 0;

    if (!vCompare(mDashOffset, 0.0f)) {
        float totalLength = 0.0;
        for (size_t i = 0; i < mArraySize; i++) {
            totalLength = mDashArray[i].length + mDashArray[i].gap;
        }
        float normalizeLen = std::fmod(mDashOffset, totalLength);
        if (normalizeLen < 0.0f) {
            normalizeLen = totalLength + normalizeLen;
        }
        // now the length is less than total length and +ve
        // findout the current dash index , dashlength and gap.
        for (size_t i = 0; i < mArraySize; i++) {
            if (normalizeLen < mDashArray[i].length) {
                mIndex = i;
                mCurrentLength = mDashArray[i].length - normalizeLen;
                mDiscard = false;
                break;
            }
            normalizeLen -= mDashArray[i].length;
            if (normalizeLen < mDashArray[i].gap) {
                mIndex = i;
                mCurrentLength = mDashArray[i].gap - normalizeLen;
                mDiscard = true;
                break;
            }
            normalizeLen -= mDashArray[i].gap;
        }
    } else {
        mCurrentLength = mDashArray[mIndex].length;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}